

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O2

int run_test_getaddrinfo_basic_sync(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_getaddrinfo_t req;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(puVar2,&req,(uv_getaddrinfo_cb)0x0,"localhost",(char *)0x0,(addrinfo *)0x0)
  ;
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uv_freeaddrinfo(req.addrinfo);
    puVar2 = uv_default_loop();
    close_loop(puVar2);
    eval_a = 0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    eval_b = (int64_t)iVar1;
    if (eval_b == 0) {
      uv_library_shutdown();
      return 0;
    }
    pcVar5 = "uv_loop_close(uv_default_loop())";
    pcVar4 = "0";
    uVar3 = 0xb0;
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_getaddrinfo(uv_default_loop(), &req, ((void*)0), name, ((void*)0), ((void*)0))";
    uVar3 = 0xad;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getaddrinfo.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(getaddrinfo_basic_sync) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  uv_getaddrinfo_t req;

  ASSERT_OK(uv_getaddrinfo(uv_default_loop(),
                           &req,
                           NULL,
                           name,
                           NULL,
                           NULL));
  uv_freeaddrinfo(req.addrinfo);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}